

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

int FindCollisions<Blob<224>>
              (vector<Blob<224>,_std::allocator<Blob<224>_>_> *hashes,
              HashSet<Blob<224>_> *collisions,int maxCollisions)

{
  bool bVar1;
  set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_> *psVar2;
  reference this;
  reference k;
  size_type sVar3;
  int in_EDX;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_RDI;
  pair<std::_Rb_tree_const_iterator<Blob<224>_>,_bool> pVar4;
  size_t hnb;
  int collcount;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<Blob<224>_*,_std::vector<Blob<224>,_std::allocator<Blob<224>_>_>_>
  in_stack_ffffffffffffffb8;
  __normal_iterator<Blob<224>_*,_std::vector<Blob<224>,_std::allocator<Blob<224>_>_>_>
  in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_> *psVar5;
  set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_> *this_00;
  int local_18;
  
  local_18 = 0;
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::begin(in_stack_ffffffffffffffa8);
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::end(in_stack_ffffffffffffffa8);
  std::
  sort<__gnu_cxx::__normal_iterator<Blob<224>*,std::vector<Blob<224>,std::allocator<Blob<224>>>>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  psVar5 = (set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_> *)0x1;
  while (this_00 = psVar5,
        psVar2 = (set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_> *)
                 std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::size(in_RDI), psVar5 < psVar2)
  {
    this = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::operator[]
                     (in_RDI,(size_type)this_00);
    k = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::operator[]
                  (in_RDI,(size_type)
                          ((long)&this_00[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count + 7))
    ;
    bVar1 = Blob<224>::operator==(this,k);
    if (bVar1) {
      local_18 = local_18 + 1;
      sVar3 = std::set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_>::size
                        ((set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_> *)
                         0x1916f4);
      if ((int)sVar3 < in_EDX) {
        std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::operator[](in_RDI,(size_type)this_00);
        pVar4 = std::set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_>::insert
                          (this_00,(value_type *)
                                   CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
        in_stack_ffffffffffffffc8 = pVar4.second;
      }
    }
    psVar5 = (set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_> *)
             &(this_00->_M_t)._M_impl.field_0x1;
  }
  return local_18;
}

Assistant:

int FindCollisions ( std::vector<hashtype> & hashes,
                     HashSet<hashtype> & collisions,
                     int maxCollisions )
{
  int collcount = 0;

  std::sort(hashes.begin(),hashes.end());

  for(size_t hnb = 1; hnb < hashes.size(); hnb++)
  {
    if(hashes[hnb] == hashes[hnb-1])
    {
      collcount++;
      //printHash(&hashes[hnb], sizeof(hashtype));

      if((int)collisions.size() < maxCollisions)
      {
        collisions.insert(hashes[hnb]);
      }
    }
  }

  return collcount;
}